

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_object_brand(parser *p)

{
  int iVar1;
  void *pvVar2;
  char *__s1;
  void *pvVar3;
  uint local_2c;
  wchar_t i;
  char *s;
  object_kind *k;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  __s1 = parser_getstr(p,"code");
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    local_2c = 1;
    while (((int)local_2c < (int)(uint)z_info->brand_max &&
           (iVar1 = strcmp(__s1,brands[(int)local_2c].code), iVar1 != 0))) {
      local_2c = local_2c + 1;
    }
    if (local_2c == z_info->brand_max) {
      p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_BRAND;
    }
    else {
      if (*(long *)((long)pvVar2 + 0x210) == 0) {
        pvVar3 = mem_zalloc((ulong)z_info->brand_max);
        *(void **)((long)pvVar2 + 0x210) = pvVar3;
      }
      *(undefined1 *)(*(long *)((long)pvVar2 + 0x210) + (long)(int)local_2c) = 1;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_object_brand(struct parser *p) {
	struct object_kind *k = parser_priv(p);
	const char *s = parser_getstr(p, "code");
	int i;

	if (!k) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	for (i = 1; i < z_info->brand_max; i++) {
		if (streq(s, brands[i].code)) break;
	}
	if (i == z_info->brand_max) {
		return PARSE_ERROR_UNRECOGNISED_BRAND;
	}
	if (!k->brands) {
		k->brands = mem_zalloc(z_info->brand_max * sizeof(bool));
	}
	k->brands[i] = true;
	return PARSE_ERROR_NONE;
}